

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_queue.c
# Opt level: O0

int message_queue_set_max_retry_count(MESSAGE_QUEUE_HANDLE message_queue,size_t max_retry_count)

{
  LOGGER_LOG p_Var1;
  LOGGER_LOG l;
  int result;
  size_t max_retry_count_local;
  MESSAGE_QUEUE_HANDLE message_queue_local;
  
  if (message_queue == (MESSAGE_QUEUE_HANDLE)0x0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/message_queue.c"
                ,"message_queue_set_max_retry_count",0x26b,1,
                "invalid argument (message_queue is NULL)");
    }
    l._4_4_ = 0x26c;
  }
  else {
    message_queue->max_retry_count = max_retry_count;
    l._4_4_ = 0;
  }
  return l._4_4_;
}

Assistant:

int message_queue_set_max_retry_count(MESSAGE_QUEUE_HANDLE message_queue, size_t max_retry_count)
{
    int result;

    if (message_queue == NULL)
    {
        LogError("invalid argument (message_queue is NULL)");
        result = MU_FAILURE;
    }
    else
    {
        message_queue->max_retry_count = max_retry_count;
        result = RESULT_OK;
    }

    return result;
}